

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O3

void __thiscall duckdb::DatabaseManager::DatabaseManager(DatabaseManager *this,DatabaseInstance *db)

{
  _Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_> _Var1
  ;
  _Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
  this_00;
  pointer pAVar2;
  type catalog_p;
  CatalogSet *this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_30;
  
  (this->system).
  super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>._M_t.
  super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
  .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false> =
       (_Head_base<0UL,_duckdb::AttachedDatabase_*,_false>)0x0;
  (this->databases).super_unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogSet_*,_std::default_delete<duckdb::CatalogSet>_>.
  super__Head_base<0UL,_duckdb::CatalogSet_*,_false>._M_head_impl = (CatalogSet *)0x0;
  (this->next_oid).super___atomic_base<unsigned_long>._M_i = 0;
  (this->current_query_number).super___atomic_base<unsigned_long>._M_i = 1;
  (this->current_transaction_id).super___atomic_base<unsigned_long>._M_i = 0;
  (this->default_database)._M_dataplus._M_p = (pointer)&(this->default_database).field_2;
  (this->default_database)._M_string_length = 0;
  (this->default_database).field_2._M_local_buf[0] = '\0';
  (this->db_paths_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->db_paths_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->db_paths_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->db_paths_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->db_paths_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->db_paths)._M_h._M_buckets = &(this->db_paths)._M_h._M_single_bucket;
  (this->db_paths)._M_h._M_bucket_count = 1;
  (this->db_paths)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->db_paths)._M_h._M_element_count = 0;
  (this->db_paths)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->db_paths)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->db_paths)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::AttachedDatabase_*,_false>)operator_new(0x118);
  AttachedDatabase::AttachedDatabase
            ((AttachedDatabase *)
             this_00.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl,db,
             SYSTEM_DATABASE);
  _Var1.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl =
       (this->system).
       super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
       .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>;
  (this->system).
  super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>._M_t.
  super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
  .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl !=
      (AttachedDatabase *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>.
                          _M_head_impl + 8))();
  }
  pAVar2 = unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>,_true>
           ::operator->(&this->system);
  catalog_p = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator*
                        (&pAVar2->catalog);
  this_01 = (CatalogSet *)operator_new(0x68);
  local_30._M_head_impl = (DefaultGenerator *)0x0;
  CatalogSet::CatalogSet
            (this_01,catalog_p,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_30);
  if (local_30._M_head_impl != (DefaultGenerator *)0x0) {
    (*(local_30._M_head_impl)->_vptr_DefaultGenerator[1])();
  }
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->databases,this_01);
  return;
}

Assistant:

DatabaseManager::DatabaseManager(DatabaseInstance &db)
    : next_oid(0), current_query_number(1), current_transaction_id(0) {
	system = make_uniq<AttachedDatabase>(db);
	databases = make_uniq<CatalogSet>(system->GetCatalog());
}